

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O3

CURLcode urlerr_cvt(CURLUcode ucode)

{
  if ((int)ucode < 7) {
    if (ucode == CURLUE_BAD_HANDLE) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (ucode == CURLUE_UNSUPPORTED_SCHEME) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  else {
    if (ucode == CURLUE_OUT_OF_MEMORY) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (ucode == CURLUE_LACKS_IDN) {
      return CURLE_NOT_BUILT_IN;
    }
  }
  return CURLE_URL_MALFORMAT;
}

Assistant:

CURLcode urlerr_cvt(CURLUcode ucode)
{
  if(ucode == CURLUE_OUT_OF_MEMORY)
    return CURLE_OUT_OF_MEMORY;
  else if(ucode == CURLUE_UNSUPPORTED_SCHEME)
    return CURLE_UNSUPPORTED_PROTOCOL;
  else if(ucode == CURLUE_LACKS_IDN)
    return CURLE_NOT_BUILT_IN;
  else if(ucode == CURLUE_BAD_HANDLE)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_URL_MALFORMAT;
}